

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

int double_conversion::Bignum::PlusCompare(Bignum *a,Bignum *b,Bignum *c)

{
  short sVar1;
  uint uVar2;
  Chunk CVar3;
  Chunk CVar4;
  Chunk CVar5;
  uint uVar6;
  int iVar7;
  short sVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  Bignum *this;
  
  uVar2 = (uint)(ushort)a->used_bigits_;
  uVar9 = (uint)(ushort)a->exponent_;
  do {
    this = b;
    b = a;
    sVar8 = (short)uVar9;
    iVar12 = (int)(short)uVar2 + (int)sVar8;
    uVar2 = (uint)this->used_bigits_;
    uVar9 = (uint)this->exponent_;
    a = this;
  } while (iVar12 < (int)(uVar9 + uVar2));
  sVar1 = c->exponent_;
  iVar11 = (int)c->used_bigits_ + (int)sVar1;
  iVar7 = -1;
  if (iVar11 <= iVar12 + 1) {
    if (iVar11 < iVar12) {
      iVar7 = 1;
    }
    else if (((int)sVar8 < (int)(uVar9 + uVar2)) || (iVar11 <= iVar12)) {
      if (sVar8 <= this->exponent_) {
        uVar9 = (uint)(ushort)b->exponent_;
      }
      if (sVar1 < (short)uVar9) {
        uVar9 = (int)sVar1;
      }
      uVar10 = (ulong)uVar9;
      uVar2 = 0;
      while (iVar12 = (int)uVar10, (short)uVar9 < iVar11) {
        iVar12 = iVar11 + -1;
        CVar3 = BigitOrZero(b,iVar12);
        CVar4 = BigitOrZero(this,iVar12);
        CVar5 = BigitOrZero(c,iVar12);
        uVar6 = (CVar5 + uVar2) - (CVar4 + CVar3);
        if (CVar5 + uVar2 < CVar4 + CVar3) {
          iVar12 = 1;
          break;
        }
        if (1 < uVar6) {
          iVar12 = -1;
          uVar2 = uVar6;
          break;
        }
        uVar2 = uVar6 * 0x10000000;
        iVar11 = iVar12;
      }
      iVar7 = -(uint)(uVar2 != 0);
      if ((short)uVar9 < iVar11) {
        iVar7 = iVar12;
      }
    }
  }
  return iVar7;
}

Assistant:

int Bignum::PlusCompare(const Bignum& a, const Bignum& b, const Bignum& c) {
  DOUBLE_CONVERSION_ASSERT(a.IsClamped());
  DOUBLE_CONVERSION_ASSERT(b.IsClamped());
  DOUBLE_CONVERSION_ASSERT(c.IsClamped());
  if (a.BigitLength() < b.BigitLength()) {
    return PlusCompare(b, a, c);
  }
  if (a.BigitLength() + 1 < c.BigitLength()) {
    return -1;
  }
  if (a.BigitLength() > c.BigitLength()) {
    return +1;
  }
  // The exponent encodes 0-bigits. So if there are more 0-digits in 'a' than
  // 'b' has digits, then the bigit-length of 'a'+'b' must be equal to the one
  // of 'a'.
  if (a.exponent_ >= b.BigitLength() && a.BigitLength() < c.BigitLength()) {
    return -1;
  }

  Chunk borrow = 0;
  // Starting at min_exponent all digits are == 0. So no need to compare them.
  const int min_exponent = (std::min)((std::min)(a.exponent_, b.exponent_), c.exponent_);
  for (int i = c.BigitLength() - 1; i >= min_exponent; --i) {
    const Chunk chunk_a = a.BigitOrZero(i);
    const Chunk chunk_b = b.BigitOrZero(i);
    const Chunk chunk_c = c.BigitOrZero(i);
    const Chunk sum = chunk_a + chunk_b;
    if (sum > chunk_c + borrow) {
      return +1;
    } else {
      borrow = chunk_c + borrow - sum;
      if (borrow > 1) {
        return -1;
      }
      borrow <<= kBigitSize;
    }
  }
  if (borrow == 0) {
    return 0;
  }
  return -1;
}